

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_sse_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  ulong uVar4;
  int j;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  if ((len & 0xffffffffffffffc0) == 0) {
    auVar30 = (undefined1  [16])0x0;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar8 = (undefined1  [16])0x0;
    auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar7 = (undefined1  [16])0x0;
    auVar6 = (undefined1  [16])0x0;
    auVar28 = (undefined1  [16])0x0;
    auVar27 = (undefined1  [16])0x0;
    pauVar3 = (undefined1 (*) [16])data;
  }
  else {
    auVar23._8_4_ = 0x55555555;
    auVar23._0_8_ = 0x5555555555555555;
    auVar23._12_4_ = 0x55555555;
    auVar24._8_4_ = 0x33333333;
    auVar24._0_8_ = 0x3333333333333333;
    auVar24._12_4_ = 0x33333333;
    auVar25[8] = 7;
    auVar25._0_8_ = 0x707070707070707;
    auVar25[9] = 7;
    auVar25[10] = 7;
    auVar25[0xb] = 7;
    auVar25[0xc] = 7;
    auVar25[0xd] = 7;
    auVar25[0xe] = 7;
    auVar25[0xf] = 7;
    auVar26[8] = 0x70;
    auVar26._0_8_ = 0x7070707070707070;
    auVar26[9] = 0x70;
    auVar26[10] = 0x70;
    auVar26[0xb] = 0x70;
    auVar26[0xc] = 0x70;
    auVar26[0xd] = 0x70;
    auVar26[0xe] = 0x70;
    auVar26[0xf] = 0x70;
    pauVar3 = (undefined1 (*) [16])(data + (len & 0xffffffffffffffc0));
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar27 = *(undefined1 (*) [16])data;
      pauVar1 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar2 = (undefined1 (*) [16])((long)data + 0x20);
      auVar6 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x30));
      data = (uint8_t *)((long)data + 0x40);
      auVar7 = vpandd_avx512vl(auVar27,auVar23);
      auVar8 = vpandd_avx512vl(*pauVar1,auVar23);
      auVar27 = vpsrld_avx(auVar27,1);
      auVar28 = vpsrld_avx(*pauVar1,1);
      auVar27 = vpand_avx(auVar27,auVar23);
      auVar28 = vpand_avx(auVar28,auVar23);
      auVar7 = vpaddd_avx512vl(auVar8,auVar7);
      auVar8 = vpandd_avx512vl(auVar6,auVar23);
      auVar6 = vpsrld_avx512vl(auVar6,1);
      auVar27 = vpaddd_avx(auVar28,auVar27);
      auVar28 = vpand_avx(*pauVar2,auVar23);
      auVar30 = vpsrld_avx(*pauVar2,1);
      auVar6 = vpandd_avx512vl(auVar6,auVar23);
      auVar8 = vpaddd_avx512vl(auVar8,auVar28);
      auVar28 = vpand_avx(auVar30,auVar23);
      auVar28 = vpaddd_avx512vl(auVar6,auVar28);
      auVar6 = vpandd_avx512vl(auVar7,auVar24);
      auVar30 = vpandd_avx512vl(auVar8,auVar24);
      auVar7 = vpsrld_avx512vl(auVar7,2);
      auVar29 = vpsrld_avx(auVar8,2);
      auVar8 = vpaddd_avx512vl(auVar30,auVar6);
      auVar30 = vpandd_avx512vl(auVar27,auVar24);
      auVar9 = vpandd_avx512vl(auVar28,auVar24);
      auVar6 = vpsrld_avx(auVar27,2);
      auVar31 = vpsrld_avx(auVar28,2);
      auVar7 = vpandd_avx512vl(auVar7,auVar24);
      auVar27 = vpand_avx(auVar29,auVar24);
      auVar28 = vpand_avx(auVar6,auVar24);
      auVar6 = vpand_avx(auVar31,auVar24);
      auVar9 = vpaddd_avx512vl(auVar9,auVar30);
      auVar29 = vpaddd_avx512vl(auVar27,auVar7);
      auVar30 = vpaddd_avx(auVar6,auVar28);
      auVar27 = vpandq_avx512vl(auVar8,auVar25);
      auVar27 = vpsadbw_avx(auVar27,(undefined1  [16])0x0);
      auVar27 = vpaddq_avx(auVar27,auVar16._0_16_);
      auVar16 = ZEXT1664(auVar27);
      auVar28 = vpandq_avx512vl(auVar8,auVar26);
      auVar28 = vpsadbw_avx(auVar28,(undefined1  [16])0x0);
      auVar28 = vpaddq_avx(auVar28,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar28);
      auVar6 = vpandq_avx512vl(auVar9,auVar25);
      auVar6 = vpsadbw_avx(auVar6,(undefined1  [16])0x0);
      auVar6 = vpaddq_avx(auVar6,auVar15._0_16_);
      auVar15 = ZEXT1664(auVar6);
      auVar7 = vpandq_avx512vl(auVar9,auVar26);
      auVar7 = vpsadbw_avx(auVar7,(undefined1  [16])0x0);
      auVar7 = vpaddq_avx(auVar7,auVar20._0_16_);
      auVar20 = ZEXT1664(auVar7);
      auVar8 = vpand_avx(auVar29,auVar25);
      auVar9 = vpand_avx(auVar29,auVar26);
      auVar9 = vpsadbw_avx(auVar9,(undefined1  [16])0x0);
      auVar31 = vpsadbw_avx(auVar8,(undefined1  [16])0x0);
      auVar8 = vpaddq_avx(auVar9,auVar19._0_16_);
      auVar19 = ZEXT1664(auVar8);
      auVar9 = vpand_avx(auVar30,auVar25);
      auVar29 = vpand_avx(auVar30,auVar26);
      auVar30 = vpaddq_avx(auVar31,auVar14._0_16_);
      auVar14 = ZEXT1664(auVar30);
      auVar10 = ZEXT1632(auVar30);
      auVar30 = vpsadbw_avx(auVar9,(undefined1  [16])0x0);
      auVar9 = vpsadbw_avx(auVar29,(undefined1  [16])0x0);
      auVar30 = vpaddq_avx(auVar30,auVar13._0_16_);
      auVar13 = ZEXT1664(auVar30);
      auVar30 = vpaddq_avx(auVar9,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar30);
    } while ((undefined1 (*) [16])data != pauVar3);
  }
  auVar23 = vpunpcklqdq_avx(auVar28,auVar7);
  auVar28 = vpunpckhqdq_avx(auVar28,auVar7);
  auVar24 = vpunpcklqdq_avx(auVar8,auVar30);
  auVar7 = vpunpckhqdq_avx(auVar8,auVar30);
  auVar8 = vpunpcklqdq_avx(auVar27,auVar6);
  auVar6 = vpunpckhqdq_avx(auVar27,auVar6);
  auVar27 = vpaddq_avx(auVar23,auVar28);
  auVar18._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar8;
  auVar18._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10._0_16_;
  auVar10 = vpermq_avx2(auVar10,0x55);
  auVar28 = vpaddq_avx(auVar24,auVar7);
  uVar11 = auVar13._0_8_;
  auVar21._8_8_ = uVar11;
  auVar21._0_8_ = uVar11;
  auVar21._16_8_ = uVar11;
  auVar21._24_8_ = uVar11;
  auVar14 = vinserti32x4_avx512f(auVar13,auVar27,2);
  auVar10 = vpblendd_avx2(ZEXT1632(auVar6),auVar10,0xf0);
  auVar27 = auVar13._0_16_;
  auVar12._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar27;
  auVar12._16_16_ = ZEXT116(0) * auVar13._16_16_ + ZEXT116(1) * auVar27;
  auVar18 = vpblendd_avx2(auVar18,auVar21,0xc0);
  auVar10 = vpblendd_avx2(auVar10,auVar12,0xc0);
  auVar13 = vinserti32x4_avx512f(auVar14,auVar28,3);
  auVar10 = vpaddq_avx2(auVar18,auVar10);
  auVar13 = vpsrlq_avx512f(auVar13,4);
  auVar13 = vinserti64x4_avx512f(auVar13,auVar10,0);
  auVar10 = vpmovqd_avx512f(auVar13);
  auVar10 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])flag_counts);
  *(undefined1 (*) [32])flag_counts = auVar10;
  if ((len & 0x3f) != 0) {
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        flag_counts[lVar5] =
             flag_counts[lVar5] + (uint)(((byte)(*pauVar3)[uVar4] >> ((uint)lVar5 & 0x1f) & 1) != 0)
        ;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (len & 0x3f));
  }
  return;
}

Assistant:

void pospopcnt_u8_sse_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m128i s0 = sse4_add1_even(r0, r1);
        const __m128i s1 = sse4_add1_odd (r0, r1);
        const __m128i s2 = sse4_add1_even(r2, r3);
        const __m128i s3 = sse4_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m128i d0 = sse4_add2_even(s0, s2);
        const __m128i d1 = sse4_add2_even(s1, s3);
        const __m128i d2 = sse4_add2_odd (s0, s2);
        const __m128i d3 = sse4_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i mask_lo = _mm_set1_epi8(0x0f);
        const __m128i mask_hi = _mm_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m128i sum0 = _mm_sad_epu8(d0 & mask_lo, zero);
        const __m128i sum1 = _mm_sad_epu8(d0 & mask_hi, zero);
        const __m128i sum2 = _mm_sad_epu8(d1 & mask_lo, zero);
        const __m128i sum3 = _mm_sad_epu8(d1 & mask_hi, zero);
        const __m128i sum4 = _mm_sad_epu8(d2 & mask_lo, zero);
        const __m128i sum5 = _mm_sad_epu8(d2 & mask_hi, zero);
        const __m128i sum6 = _mm_sad_epu8(d3 & mask_lo, zero);
        const __m128i sum7 = _mm_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm_add_epi64(counter_a, sum0);
        counter_b = _mm_add_epi64(counter_b, sum1);
        counter_c = _mm_add_epi64(counter_c, sum2);
        counter_d = _mm_add_epi64(counter_d, sum3);
        counter_e = _mm_add_epi64(counter_e, sum4);
        counter_f = _mm_add_epi64(counter_f, sum5);
        counter_g = _mm_add_epi64(counter_g, sum6);
        counter_h = _mm_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_c);
    flag_counts[2] += sse4_sum_epu64(counter_e);
    flag_counts[3] += sse4_sum_epu64(counter_g);
    flag_counts[4] += sse4_sum_epu64(counter_b) >> 4;
    flag_counts[5] += sse4_sum_epu64(counter_d) >> 4;
    flag_counts[6] += sse4_sum_epu64(counter_f) >> 4;
    flag_counts[7] += sse4_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}